

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall tinygraph::Graph::str_abi_cxx11_(string *__return_storage_ptr__,Graph *this)

{
  bool bVar1;
  reference __in;
  type *__rhs;
  __shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  element_type *peVar3;
  element_type *this_01;
  any *val;
  any *val_00;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  type *local_1e0;
  type *property_1;
  type *propKey_1;
  _Self local_1c8;
  iterator __end3;
  iterator __begin3;
  element_type *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  __shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_150;
  shared_ptr<tinygraph::Edge> *c;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  type *local_90;
  type *property;
  type *propKey;
  _Self local_78;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *__range2;
  type *vertex;
  type *key;
  _Self local_38;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>_>_>_>
  *__range1;
  Graph *this_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>_>_>_>
           ::begin(&this->vertices);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>_>_>_>
       ::end(&this->vertices);
  while (bVar1 = std::operator!=(&__end1,&local_38), bVar1) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>_>_>
           ::operator*(&__end1);
    __rhs = std::get<0ul,std::__cxx11::string_const,std::shared_ptr<tinygraph::Vertex>>(__in);
    this_00 = (__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::get<1ul,std::__cxx11::string_const,std::shared_ptr<tinygraph::Vertex>>(__in);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)__rhs);
    peVar2 = std::__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
             ::begin(&peVar2->properties);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         ::end(&peVar2->properties);
    while (bVar1 = std::operator!=(&__end2,&local_78), bVar1) {
      propKey = &std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                 ::operator*(&__end2)->first;
      property = (type *)std::get<0ul,std::__cxx11::string_const,std::any>
                                   ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                                     *)propKey);
      local_90 = std::get<1ul,std::__cxx11::string_const,std::any>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                             *)propKey);
      std::operator+(&local_110," [",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)property);
      std::operator+(&local_f0,&local_110," = ");
      any_to_str_abi_cxx11_((string *)&__range2_1,(tinygraph *)local_90,val);
      std::operator+(&local_d0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range2_1);
      std::operator+(&local_b0,&local_d0,"]");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&__range2_1);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    peVar2 = std::__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    __end2_1 = std::
               vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>
               ::begin(&peVar2->connections);
    c = (shared_ptr<tinygraph::Edge> *)
        std::
        vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>
        ::end(&peVar2->connections);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::shared_ptr<tinygraph::Edge>_*,_std::vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>_>
                               *)&c), bVar1) {
      local_150 = (__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<tinygraph::Edge>_*,_std::vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>_>
                  ::operator*(&__end2_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     "\t",__rhs);
      std::operator+(&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                     " -> ");
      peVar3 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_150);
      peVar2 = std::__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar3);
      std::operator+(&local_170,&local_190,&peVar2->name);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&__range3);
      peVar3 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_150);
      this_01 = std::
                __shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->properties);
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               ::begin(this_01);
      local_1c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::end(this_01);
      while (bVar1 = std::operator!=(&__end3,&local_1c8), bVar1) {
        propKey_1 = &std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                     ::operator*(&__end3)->first;
        property_1 = (type *)std::get<0ul,std::__cxx11::string_const,std::any>
                                       ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                                         *)propKey_1);
        local_1e0 = std::get<1ul,std::__cxx11::string_const,std::any>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                                *)propKey_1);
        std::operator+(&local_260," [",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       property_1);
        std::operator+(&local_240,&local_260," = ");
        any_to_str_abi_cxx11_(&local_280,(tinygraph *)local_1e0,val_00);
        std::operator+(&local_220,&local_240,&local_280);
        std::operator+(&local_200,&local_220,"]");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<tinygraph::Edge>_*,_std::vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tinygraph::Vertex>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Graph::str() {
        std::string res;

        for (const auto& [key, vertex] : this->vertices) {
            res += key;

            for (const auto& [propKey, property] : vertex->properties) {
                res += " [" + propKey + " = " + any_to_str(&property) + "]";
            }

            res += "\n";

            for (const auto& c : vertex->connections) {
                res += "\t" + key + " -> " + c->to->name;

                for (const auto& [propKey, property] : *c->properties) {
                    res += " [" + propKey + " = " + any_to_str(&property) + "]";
                }

                res += "\n";
            }
        }

        return res;
    }